

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationDriveline.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorRotationDriveline::Initialize
          (ChLinkMotorRotationDriveline *this,shared_ptr<chrono::ChBodyFrame> *mbody1,
          shared_ptr<chrono::ChBodyFrame> *mbody2,bool pos_are_relative,ChVector<double> *mpt1,
          ChVector<double> *mpt2,ChVector<double> mnorm1,ChVector<double> mnorm2)

{
  ChShaftsBody *pCVar1;
  __shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2> local_108;
  __shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2> local_f8;
  __shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> local_d8;
  __shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2> local_c8;
  __shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> local_b8;
  ChVector<double> local_a8;
  ChVector<double> local_88;
  ChVector<double> local_68;
  ChVector<double> local_48;
  
  std::__shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_f8,&mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)
  ;
  std::__shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_108,&mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>
            );
  local_48.m_data[0] = mpt1->m_data[0];
  local_48.m_data[1] = mpt1->m_data[1];
  local_48.m_data[2] = mpt1->m_data[2];
  local_68.m_data[0] = mpt2->m_data[0];
  local_68.m_data[1] = mpt2->m_data[1];
  local_68.m_data[2] = mpt2->m_data[2];
  local_88.m_data[0] = *(double *)mnorm1.m_data[0];
  local_88.m_data[1] = *(double *)((long)mnorm1.m_data[0] + 8);
  local_88.m_data[2] = *(double *)((long)mnorm1.m_data[0] + 0x10);
  local_a8.m_data[0] = *(double *)mnorm1.m_data[1];
  local_a8.m_data[1] = *(double *)((long)mnorm1.m_data[1] + 8);
  local_a8.m_data[2] = *(double *)((long)mnorm1.m_data[1] + 0x10);
  ChLinkMateGeneric::Initialize
            ((ChLinkMateGeneric *)this,(shared_ptr<chrono::ChBodyFrame> *)&local_f8,
             (shared_ptr<chrono::ChBodyFrame> *)&local_108,pos_are_relative,&local_48,&local_68,
             &local_88,&local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8._M_refcount);
  pCVar1 = (this->innerconstraint1).
           super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_b8,
             (__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_ChLinkMotorRotation).field_0x278);
  std::__shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_c8,&mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)
  ;
  ChShaftsBody::Initialize
            (pCVar1,(shared_ptr<chrono::ChShaft> *)&local_b8,
             (shared_ptr<chrono::ChBodyFrame> *)&local_c8,(ChVector<double> *)&VECT_Z);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
  pCVar1 = (this->innerconstraint2).
           super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_d8,
             &(this->innershaft2).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_e8,&mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)
  ;
  ChShaftsBody::Initialize
            (pCVar1,(shared_ptr<chrono::ChShaft> *)&local_d8,
             (shared_ptr<chrono::ChBodyFrame> *)&local_e8,(ChVector<double> *)&VECT_Z);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8._M_refcount);
  return;
}

Assistant:

void ChLinkMotorRotationDriveline::Initialize(std::shared_ptr<ChBodyFrame> mbody1,
                                              std::shared_ptr<ChBodyFrame> mbody2,
                                              bool pos_are_relative,
                                              ChVector<> mpt1,
                                              ChVector<> mpt2,
                                              ChVector<> mnorm1,
                                              ChVector<> mnorm2) {
    ChLinkMotorRotation::Initialize(mbody1, mbody2, pos_are_relative, mpt1, mpt2, mnorm1, mnorm2);
    innerconstraint1->Initialize(innershaft1, mbody1, VECT_Z);
    innerconstraint2->Initialize(innershaft2, mbody2, VECT_Z);
}